

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteGroupMaybeToArray
               (int field_number,MessageLite *value,CodedOutputStream *output)

{
  int iVar1;
  int size;
  CodedOutputStream *output_local;
  MessageLite *value_local;
  int field_number_local;
  
  WriteTag(field_number,WIRETYPE_START_GROUP,output);
  iVar1 = protobuf::MessageLite::GetCachedSize(value);
  WriteSubMessageMaybeToArray(iVar1,value,output);
  WriteTag(field_number,WIRETYPE_END_GROUP,output);
  return;
}

Assistant:

void WireFormatLite::WriteGroupMaybeToArray(int field_number,
                                            const MessageLite& value,
                                            io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_START_GROUP, output);
  const int size = value.GetCachedSize();
  WriteSubMessageMaybeToArray(size, value, output);
  WriteTag(field_number, WIRETYPE_END_GROUP, output);
}